

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRPluginManager.cpp
# Opt level: O1

void __thiscall MinVR::VRPluginManager::~VRPluginManager(VRPluginManager *this)

{
  VRPlugin *pVVar1;
  pointer ppVVar2;
  pointer ppVVar3;
  ulong uVar4;
  
  this->_vptr_VRPluginManager = (version_t **)&PTR__VRPluginManager_00176940;
  ppVVar2 = (this->_plugins).
            super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_plugins).super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppVVar2) {
    uVar4 = 0;
    do {
      (**(code **)(*(long *)ppVVar2[uVar4] + 0x18))(ppVVar2[uVar4],this->_vrMain);
      pVVar1 = (this->_plugins).
               super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4];
      if (pVVar1 != (VRPlugin *)0x0) {
        (**(code **)(*(long *)pVVar1 + 8))();
      }
      uVar4 = uVar4 + 1;
      ppVVar2 = (this->_plugins).
                super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->_plugins).
                                   super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar2 >> 3))
    ;
  }
  ppVVar3 = (this->_libraries).
            super__Vector_base<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_libraries).
      super__Vector_base<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppVVar3) {
    uVar4 = 0;
    do {
      if (ppVVar3[uVar4] != (VRSharedLibrary *)0x0) {
        (*ppVVar3[uVar4]->_vptr_VRSharedLibrary[1])();
      }
      uVar4 = uVar4 + 1;
      ppVVar3 = (this->_libraries).
                super__Vector_base<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->_libraries).
                                   super__Vector_base<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar3 >> 3))
    ;
  }
  if (ppVVar3 != (pointer)0x0) {
    operator_delete(ppVVar3,(long)(this->_libraries).
                                  super__Vector_base<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar3
                   );
  }
  ppVVar2 = (this->_plugins).
            super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar2 != (pointer)0x0) {
    operator_delete(ppVVar2,(long)(this->_plugins).
                                  super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar2
                   );
    return;
  }
  return;
}

Assistant:

VRPluginManager::~VRPluginManager() {
	for (size_t f = 0; f < _plugins.size(); f++)
	{
		_plugins[f]->unregisterWithMinVR(_vrMain);
		delete _plugins[f];
	}

	for (size_t f = 0; f < _libraries.size(); f++)
	{
		delete _libraries[f];
	}
}